

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDBusIntrospection::Argument>::moveAppend
          (QGenericArrayOps<QDBusIntrospection::Argument> *this,Argument *b,Argument *e)

{
  Argument *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qint64 qVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pAVar1 = (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).size;
    do {
      qVar5 = (b->location).columnNumber;
      pAVar1[qVar6].location.lineNumber = (b->location).lineNumber;
      pAVar1[qVar6].location.columnNumber = qVar5;
      pDVar2 = (b->type).d.d;
      (b->type).d.d = (Data *)0x0;
      pAVar1[qVar6].type.d.d = pDVar2;
      pcVar3 = (b->type).d.ptr;
      (b->type).d.ptr = (char16_t *)0x0;
      pAVar1[qVar6].type.d.ptr = pcVar3;
      qVar4 = (b->type).d.size;
      (b->type).d.size = 0;
      pAVar1[qVar6].type.d.size = qVar4;
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pAVar1[qVar6].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pAVar1[qVar6].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pAVar1[qVar6].name.d.size = qVar4;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).size + 1;
      (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }